

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteConstant
               (int constant,idx_t count,void *data_ptr,bool all_invalid)

{
  int *piVar1;
  
  ReserveSpace((BitpackingCompressionState<int,_true,_int> *)data_ptr,4);
  WriteMetaData((BitpackingCompressionState<int,_true,_int> *)data_ptr,CONSTANT);
  piVar1 = *(int **)((long)data_ptr + 0x40);
  *piVar1 = constant;
  *(int **)((long)data_ptr + 0x40) = piVar1 + 1;
  UpdateStats((BitpackingCompressionState<int,_true,_int> *)data_ptr,count);
  return;
}

Assistant:

static void WriteConstant(T constant, idx_t count, void *data_ptr, bool all_invalid) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}